

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

void pospopcnt_u32_sse_harley_seal_improved(uint32_t *array,size_t len,uint32_t *flags)

{
  __m128i *l;
  __m128i *l_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  int *in_RDX;
  longlong lVar9;
  ulong in_RSI;
  long in_RDI;
  undefined8 in_R8;
  longlong lVar10;
  undefined8 in_R9;
  longlong lVar11;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  __m128i c_07;
  __m128i c_08;
  __m128i c_09;
  __m128i c_10;
  __m128i c_11;
  __m128i c_12;
  __m128i c_13;
  int j_4;
  size_t i_6;
  int j_3;
  size_t i_5;
  int j_2;
  size_t i_4;
  int j_1;
  size_t i_3;
  __m128i mask_1;
  __m128i S1_1;
  __m128i S0_1;
  __m128i n1_1;
  __m128i n0_1;
  __m128i t1_1;
  __m128i s1_1;
  __m128i s0_1;
  __m128i m1_1;
  __m128i m0_1;
  __m128i t0_1;
  __m128i mask;
  __m128i S1;
  __m128i S0;
  __m128i n1;
  __m128i n0;
  __m128i t1;
  __m128i s1;
  __m128i s0;
  __m128i m1;
  __m128i m0;
  __m128i t0;
  size_t thislimit;
  size_t i_2;
  __m128i lookup;
  __m128i counter [8];
  uint32_t buffer [4];
  uint64_t i;
  uint64_t limit;
  __m128i eightsB;
  __m128i eightsA;
  __m128i foursB;
  __m128i foursA;
  __m128i twosB;
  __m128i twosA;
  __m128i v16;
  __m128i v8;
  __m128i v4;
  __m128i v2;
  __m128i v1;
  size_t size;
  __m128i *data;
  int j;
  size_t i_1;
  int local_1234;
  ulong local_1230;
  int local_1224;
  ulong local_1220;
  int local_1214;
  ulong local_1210;
  int local_1204;
  ulong local_1200;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  ulong local_1098;
  ulong local_1090;
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  uint local_ff8 [4];
  ulong local_fe8;
  ulong local_fe0;
  longlong local_fd8 [2];
  longlong local_fc8 [2];
  longlong local_fb8 [2];
  longlong local_fa8 [2];
  longlong local_f98 [2];
  longlong local_f88 [2];
  longlong local_f78;
  longlong lStack_f70;
  longlong local_f68 [9];
  ulong local_f20;
  long local_f18;
  int local_f0c;
  ulong local_f08;
  int *local_f00;
  undefined1 local_ee8 [16];
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined1 local_ec8 [16];
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined1 local_ea8 [16];
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined1 local_e88 [16];
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined1 local_e68 [16];
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined1 local_e48 [16];
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined1 local_e28 [16];
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined1 local_e08 [16];
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined1 local_de8 [16];
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined1 local_dc8 [16];
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined1 local_da8 [16];
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined1 local_d88 [16];
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined1 local_d68 [16];
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined1 local_d48 [16];
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined1 local_d28 [16];
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined1 local_d08 [16];
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined2 local_ce0;
  undefined2 local_cde;
  undefined2 local_cdc;
  undefined2 local_cda;
  undefined1 local_cd8 [16];
  undefined2 local_cc8;
  undefined2 local_cc6;
  undefined2 local_cc4;
  undefined2 local_cc2;
  undefined2 local_cc0;
  undefined2 local_cbe;
  undefined2 local_cbc;
  undefined2 local_cba;
  undefined1 local_cb8 [16];
  undefined2 local_ca8;
  undefined2 local_ca6;
  undefined2 local_ca4;
  undefined2 local_ca2;
  undefined2 local_ca0;
  undefined2 local_c9e;
  undefined2 local_c9c;
  undefined2 local_c9a;
  undefined1 local_c98 [16];
  undefined2 local_c88;
  undefined2 local_c86;
  undefined2 local_c84;
  undefined2 local_c82;
  undefined2 local_c80;
  undefined2 local_c7e;
  undefined2 local_c7c;
  undefined2 local_c7a;
  undefined1 local_c78 [16];
  undefined2 local_c68;
  undefined2 local_c66;
  undefined2 local_c64;
  undefined2 local_c62;
  undefined2 local_c60;
  undefined2 local_c5e;
  undefined2 local_c5c;
  undefined2 local_c5a;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined1 local_c48 [16];
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined1 local_c28 [16];
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined1 local_c08 [16];
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined1 local_bc8 [16];
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined1 local_ba8 [16];
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined1 local_b88 [16];
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined1 local_b48 [16];
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined1 local_b08 [16];
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined1 local_ac8 [16];
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined1 local_aa8 [16];
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined1 local_a88 [16];
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined1 local_a48 [16];
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined1 local_a28 [16];
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined1 local_a08 [16];
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined1 local_9c8 [16];
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined1 local_988 [16];
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  long local_958;
  long local_950;
  long local_948;
  long local_940;
  long local_938;
  long local_930;
  long local_928;
  long local_920;
  long local_918;
  long local_910;
  long local_908;
  long local_900;
  long local_8f8;
  long local_8f0;
  long local_8e8;
  long local_8e0;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_870;
  undefined1 local_86f;
  undefined1 local_86e;
  undefined1 local_86d;
  undefined1 local_86c;
  undefined1 local_86b;
  undefined1 local_86a;
  undefined1 local_869;
  undefined1 local_868 [16];
  undefined8 local_858;
  undefined8 uStack_850;
  undefined1 local_848 [16];
  undefined8 local_838;
  undefined8 uStack_830;
  undefined1 local_7a8 [16];
  uint *local_790;
  undefined1 local_788 [16];
  uint *local_770;
  undefined1 local_768 [16];
  uint *local_750;
  undefined1 local_748 [16];
  uint *local_730;
  undefined1 local_728 [16];
  uint *local_710;
  undefined1 local_708 [16];
  uint *local_6f0;
  undefined1 local_6e8 [16];
  uint *local_6d0;
  undefined1 local_6c8 [16];
  uint *local_6b8;
  undefined4 local_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined4 local_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined4 local_66c;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined4 local_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined4 local_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined4 local_60c;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined4 local_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined4 local_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined4 local_5ac;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined4 local_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined4 local_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined4 local_54c;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined4 local_52c;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined4 local_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined4 local_4ec;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined4 local_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined4 local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined4 local_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined4 local_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined4 local_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined4 local_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined4 local_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined4 local_3dc;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined4 local_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined4 local_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined4 local_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 local_368;
  undefined1 local_367;
  undefined1 local_366;
  undefined1 local_365;
  undefined1 local_364;
  undefined1 local_363;
  undefined1 local_362;
  undefined1 local_361;
  undefined1 local_360;
  undefined1 local_35f;
  undefined1 local_35e;
  undefined1 local_35d;
  undefined1 local_35c;
  undefined1 local_35b;
  undefined1 local_35a;
  undefined1 local_359;
  undefined8 local_358;
  undefined8 uStack_350;
  longlong local_348;
  longlong lStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  longlong local_328;
  longlong lStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 local_218 [16];
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  undefined1 local_205;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  undefined1 local_200;
  undefined1 local_1ff;
  undefined1 local_1fe;
  undefined1 local_1fd;
  undefined1 local_1fc;
  undefined1 local_1fb;
  undefined1 local_1fa;
  undefined1 local_1f9;
  undefined1 local_1f8 [16];
  undefined1 local_1e8;
  undefined1 local_1e7;
  undefined1 local_1e6;
  undefined1 local_1e5;
  undefined1 local_1e4;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  undefined1 local_1e0;
  undefined1 local_1df;
  undefined1 local_1de;
  undefined1 local_1dd;
  undefined1 local_1dc;
  undefined1 local_1db;
  undefined1 local_1da;
  undefined1 local_1d9;
  undefined1 local_1d8 [16];
  undefined1 local_1c8;
  undefined1 local_1c7;
  undefined1 local_1c6;
  undefined1 local_1c5;
  undefined1 local_1c4;
  undefined1 local_1c3;
  undefined1 local_1c2;
  undefined1 local_1c1;
  undefined1 local_1c0;
  undefined1 local_1bf;
  undefined1 local_1be;
  undefined1 local_1bd;
  undefined1 local_1bc;
  undefined1 local_1bb;
  undefined1 local_1ba;
  undefined1 local_1b9;
  undefined1 local_1b8 [16];
  undefined1 local_1a8;
  undefined1 local_1a7;
  undefined1 local_1a6;
  undefined1 local_1a5;
  undefined1 local_1a4;
  undefined1 local_1a3;
  undefined1 local_1a2;
  undefined1 local_1a1;
  undefined1 local_1a0;
  undefined1 local_19f;
  undefined1 local_19e;
  undefined1 local_19d;
  undefined1 local_19c;
  undefined1 local_19b;
  undefined1 local_19a;
  undefined1 local_199;
  undefined1 local_198 [16];
  undefined1 local_188;
  undefined1 local_187;
  undefined1 local_186;
  undefined1 local_185;
  undefined1 local_184;
  undefined1 local_183;
  undefined1 local_182;
  undefined1 local_181;
  undefined1 local_180;
  undefined1 local_17f;
  undefined1 local_17e;
  undefined1 local_17d;
  undefined1 local_17c;
  undefined1 local_17b;
  undefined1 local_17a;
  undefined1 local_179;
  undefined1 local_178 [16];
  undefined1 local_168;
  undefined1 local_167;
  undefined1 local_166;
  undefined1 local_165;
  undefined1 local_164;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  undefined1 local_160;
  undefined1 local_15f;
  undefined1 local_15e;
  undefined1 local_15d;
  undefined1 local_15c;
  undefined1 local_15b;
  undefined1 local_15a;
  undefined1 local_159;
  undefined1 local_158 [16];
  undefined1 local_148;
  undefined1 local_147;
  undefined1 local_146;
  undefined1 local_145;
  undefined1 local_144;
  undefined1 local_143;
  undefined1 local_142;
  undefined1 local_141;
  undefined1 local_140;
  undefined1 local_13f;
  undefined1 local_13e;
  undefined1 local_13d;
  undefined1 local_13c;
  undefined1 local_13b;
  undefined1 local_13a;
  undefined1 local_139;
  undefined1 local_138 [16];
  undefined1 local_128;
  undefined1 local_127;
  undefined1 local_126;
  undefined1 local_125;
  undefined1 local_124;
  undefined1 local_123;
  undefined1 local_122;
  undefined1 local_121;
  undefined1 local_120;
  undefined1 local_11f;
  undefined1 local_11e;
  undefined1 local_11d;
  undefined1 local_11c;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  undefined1 local_118 [16];
  undefined1 local_108;
  undefined1 local_107;
  undefined1 local_106;
  undefined1 local_105;
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  undefined1 local_100;
  undefined1 local_ff;
  undefined1 local_fe;
  undefined1 local_fd;
  undefined1 local_fc;
  undefined1 local_fb;
  undefined1 local_fa;
  undefined1 local_f9;
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined1 local_b8 [16];
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined1 local_78 [16];
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined1 local_58 [16];
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  int *piVar8;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  longlong extraout_RDX_07;
  longlong extraout_RDX_08;
  longlong extraout_RDX_09;
  longlong extraout_RDX_10;
  longlong extraout_RDX_11;
  longlong extraout_RDX_12;
  
  piVar8 = in_RDX;
  for (local_f08 = in_RSI - (in_RSI & 0x3f); local_f08 < in_RSI; local_f08 = local_f08 + 1) {
    for (local_f0c = 0; local_f0c < 0x20; local_f0c = local_f0c + 1) {
      uVar7 = ((*(uint *)(in_RDI + local_f08 * 4) & 1 << ((byte)local_f0c & 0x1f)) >>
              ((byte)local_f0c & 0x1f)) + in_RDX[local_f0c];
      piVar8 = (int *)(ulong)uVar7;
      in_RDX[local_f0c] = uVar7;
    }
  }
  local_f20 = in_RSI >> 2;
  local_888 = (undefined1  [16])0x0;
  local_f68[6] = 0;
  local_f68[7] = 0;
  local_898 = (undefined1  [16])0x0;
  local_f68[4] = 0;
  local_f68[5] = 0;
  local_8a8 = (undefined1  [16])0x0;
  local_f68[2] = 0;
  local_f68[3] = 0;
  local_8b8 = (undefined1  [16])0x0;
  local_f68[0] = 0;
  local_f68[1] = 0;
  local_8c8 = (undefined1  [16])0x0;
  local_f78 = 0;
  lStack_f70 = 0;
  local_fe0 = local_f20 & 0xfffffffffffffff0;
  local_fe8 = 0;
  local_359 = 0;
  local_35a = 4;
  local_35b = 8;
  local_35c = 0xc;
  local_35d = 1;
  local_35e = 5;
  local_35f = 9;
  local_360 = 0xd;
  local_361 = 2;
  local_362 = 6;
  local_363 = 10;
  local_364 = 0xe;
  local_365 = 3;
  local_366 = 7;
  local_367 = 0xb;
  local_368 = 0xf;
  lVar11 = CONCAT71((int7)((ulong)in_R9 >> 8),9);
  lVar10 = CONCAT71((int7)((ulong)in_R8 >> 8),5);
  lVar9 = CONCAT71((int7)((ulong)piVar8 >> 8),8);
  local_1f9 = 0xf;
  local_1fa = 0xb;
  local_1fb = 7;
  local_1fc = 3;
  local_1fd = 0xe;
  local_1fe = 10;
  local_1ff = 6;
  local_200 = 2;
  local_201 = 0xd;
  local_202 = 9;
  local_203 = 5;
  local_204 = 1;
  local_205 = 0xc;
  local_206 = 8;
  local_207 = 4;
  local_208 = 0;
  auVar1 = vpinsrb_avx(ZEXT116(0),4,1);
  auVar1 = vpinsrb_avx(auVar1,8,2);
  auVar1 = vpinsrb_avx(auVar1,0xc,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,5,5);
  auVar1 = vpinsrb_avx(auVar1,9,6);
  auVar1 = vpinsrb_avx(auVar1,0xd,7);
  auVar1 = vpinsrb_avx(auVar1,2,8);
  auVar1 = vpinsrb_avx(auVar1,6,9);
  auVar1 = vpinsrb_avx(auVar1,10,10);
  auVar1 = vpinsrb_avx(auVar1,0xe,0xb);
  auVar1 = vpinsrb_avx(auVar1,3,0xc);
  auVar1 = vpinsrb_avx(auVar1,7,0xd);
  auVar1 = vpinsrb_avx(auVar1,0xb,0xe);
  auVar1 = vpinsrb_avx(auVar1,0xf,0xf);
  local_218._0_8_ = auVar1._0_8_;
  uVar5 = local_218._0_8_;
  local_218._8_8_ = auVar1._8_8_;
  uVar6 = local_218._8_8_;
  local_f18 = in_RDI;
  local_f00 = in_RDX;
  local_218 = auVar1;
  while (local_fe8 < local_fe0) {
    for (local_1090 = 0; local_1090 < 8; local_1090 = local_1090 + 1) {
      local_8d8 = (undefined1  [16])0x0;
      *(undefined8 *)(local_1078 + local_1090 * 0x10) = 0;
      *(undefined8 *)(local_1078 + local_1090 * 0x10 + 8) = 0;
    }
    local_1098 = local_fe0;
    if (0xffff < local_fe0 - local_fe8) {
      local_1098 = local_fe8 + 0xffff;
    }
    for (; local_fe8 < local_1098; local_fe8 = local_fe8 + 0x10) {
      local_8e0 = local_f18 + local_fe8 * 0x10;
      b[1] = local_fe8 * 0x10;
      local_8e8 = local_f18 + 0x10 + b[1];
      l = (__m128i *)(local_f68 + 6);
      b[0] = lVar9;
      c[1] = lVar11;
      c[0] = lVar10;
      pospopcnt_csa_sse(&local_f88,l,b,c);
      local_8f0 = local_f18 + 0x20 + local_fe8 * 0x10;
      b_00[1] = local_fe8 * 0x10;
      local_8f8 = local_f18 + 0x30 + b_00[1];
      b_00[0] = extraout_RDX;
      c_00[1] = lVar11;
      c_00[0] = lVar10;
      pospopcnt_csa_sse(&local_f98,l,b_00,c_00);
      l_00 = (__m128i *)(local_f68 + 4);
      b_01[1] = b_00[1];
      b_01[0] = extraout_RDX_00;
      c_01[1] = lVar11;
      c_01[0] = lVar10;
      pospopcnt_csa_sse(&local_fa8,l_00,b_01,c_01);
      local_900 = local_f18 + 0x40 + local_fe8 * 0x10;
      b_02[1] = local_fe8 * 0x10;
      local_908 = local_f18 + 0x50 + b_02[1];
      b_02[0] = extraout_RDX_01;
      c_02[1] = lVar11;
      c_02[0] = lVar10;
      pospopcnt_csa_sse(&local_f88,l,b_02,c_02);
      local_910 = local_f18 + 0x60 + local_fe8 * 0x10;
      b_03[1] = local_fe8 * 0x10;
      local_918 = local_f18 + 0x70 + b_03[1];
      b_03[0] = extraout_RDX_02;
      c_03[1] = lVar11;
      c_03[0] = lVar10;
      pospopcnt_csa_sse(&local_f98,l,b_03,c_03);
      b_04[1] = b_03[1];
      b_04[0] = extraout_RDX_03;
      c_04[1] = lVar11;
      c_04[0] = lVar10;
      pospopcnt_csa_sse(&local_fb8,l_00,b_04,c_04);
      b_05[1] = b_03[1];
      b_05[0] = extraout_RDX_04;
      c_05[1] = lVar11;
      c_05[0] = lVar10;
      pospopcnt_csa_sse(&local_fc8,(__m128i *)(local_f68 + 2),b_05,c_05);
      local_920 = local_f18 + 0x80 + local_fe8 * 0x10;
      b_06[1] = local_fe8 * 0x10;
      local_928 = local_f18 + 0x90 + b_06[1];
      b_06[0] = extraout_RDX_05;
      c_06[1] = lVar11;
      c_06[0] = lVar10;
      pospopcnt_csa_sse(&local_f88,l,b_06,c_06);
      local_930 = local_f18 + 0xa0 + local_fe8 * 0x10;
      b_07[1] = local_fe8 * 0x10;
      local_938 = local_f18 + 0xb0 + b_07[1];
      b_07[0] = extraout_RDX_06;
      c_07[1] = lVar11;
      c_07[0] = lVar10;
      pospopcnt_csa_sse(&local_f98,l,b_07,c_07);
      b_08[1] = b_07[1];
      b_08[0] = extraout_RDX_07;
      c_08[1] = lVar11;
      c_08[0] = lVar10;
      pospopcnt_csa_sse(&local_fa8,l_00,b_08,c_08);
      local_940 = local_f18 + 0xc0 + local_fe8 * 0x10;
      b_09[1] = local_fe8 * 0x10;
      local_948 = local_f18 + 0xd0 + b_09[1];
      b_09[0] = extraout_RDX_08;
      c_09[1] = lVar11;
      c_09[0] = lVar10;
      pospopcnt_csa_sse(&local_f88,l,b_09,c_09);
      local_950 = local_f18 + 0xe0 + local_fe8 * 0x10;
      b_10[1] = local_fe8 * 0x10;
      local_958 = local_f18 + 0xf0 + b_10[1];
      b_10[0] = extraout_RDX_09;
      c_10[1] = lVar11;
      c_10[0] = lVar10;
      pospopcnt_csa_sse(&local_f98,l,b_10,c_10);
      b_11[1] = b_10[1];
      b_11[0] = extraout_RDX_10;
      c_11[1] = lVar11;
      c_11[0] = lVar10;
      pospopcnt_csa_sse(&local_fb8,l_00,b_11,c_11);
      b_12[1] = b_10[1];
      b_12[0] = extraout_RDX_11;
      c_12[1] = lVar11;
      c_12[0] = lVar10;
      pospopcnt_csa_sse(&local_fd8,(__m128i *)(local_f68 + 2),b_12,c_12);
      local_328 = local_f78;
      lStack_320 = lStack_f70;
      local_338 = uVar5;
      uStack_330 = uVar6;
      auVar2._8_8_ = lStack_f70;
      auVar2._0_8_ = local_f78;
      auVar4 = vpshufb_avx(auVar2,auVar1);
      local_10a8 = auVar4._0_8_;
      uStack_10a0 = auVar4._8_8_;
      local_869 = 0x55;
      local_1d9 = 0x55;
      local_1da = 0x55;
      local_1db = 0x55;
      local_1dc = 0x55;
      local_1dd = 0x55;
      local_1de = 0x55;
      local_1df = 0x55;
      local_1e0 = 0x55;
      local_1e1 = 0x55;
      local_1e2 = 0x55;
      local_1e3 = 0x55;
      local_1e4 = 0x55;
      local_1e5 = 0x55;
      local_1e6 = 0x55;
      local_1e7 = 0x55;
      local_1e8 = 0x55;
      auVar2 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
      auVar2 = vpinsrb_avx(auVar2,0x55,2);
      auVar2 = vpinsrb_avx(auVar2,0x55,3);
      auVar2 = vpinsrb_avx(auVar2,0x55,4);
      auVar2 = vpinsrb_avx(auVar2,0x55,5);
      auVar2 = vpinsrb_avx(auVar2,0x55,6);
      auVar2 = vpinsrb_avx(auVar2,0x55,7);
      auVar2 = vpinsrb_avx(auVar2,0x55,8);
      auVar2 = vpinsrb_avx(auVar2,0x55,9);
      auVar2 = vpinsrb_avx(auVar2,0x55,10);
      auVar2 = vpinsrb_avx(auVar2,0x55,0xb);
      auVar2 = vpinsrb_avx(auVar2,0x55,0xc);
      auVar2 = vpinsrb_avx(auVar2,0x55,0xd);
      auVar2 = vpinsrb_avx(auVar2,0x55,0xe);
      local_1f8 = vpinsrb_avx(auVar2,0x55,0xf);
      local_968 = local_10a8;
      uStack_960 = uStack_10a0;
      local_978 = local_1f8._0_8_;
      uStack_970 = local_1f8._8_8_;
      auVar2 = vpand_avx(auVar4,local_1f8);
      local_4c8 = local_10a8;
      uStack_4c0 = uStack_10a0;
      local_4cc = 1;
      local_988 = vpsrld_avx(auVar4,ZEXT416(1));
      local_86a = 0x55;
      local_1b9 = 0x55;
      local_1ba = 0x55;
      local_1bb = 0x55;
      local_1bc = 0x55;
      local_1bd = 0x55;
      local_1be = 0x55;
      local_1bf = 0x55;
      local_1c0 = 0x55;
      local_1c1 = 0x55;
      local_1c2 = 0x55;
      local_1c3 = 0x55;
      local_1c4 = 0x55;
      local_1c5 = 0x55;
      local_1c6 = 0x55;
      local_1c7 = 0x55;
      local_1c8 = 0x55;
      auVar4 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
      auVar4 = vpinsrb_avx(auVar4,0x55,2);
      auVar4 = vpinsrb_avx(auVar4,0x55,3);
      auVar4 = vpinsrb_avx(auVar4,0x55,4);
      auVar4 = vpinsrb_avx(auVar4,0x55,5);
      auVar4 = vpinsrb_avx(auVar4,0x55,6);
      auVar4 = vpinsrb_avx(auVar4,0x55,7);
      auVar4 = vpinsrb_avx(auVar4,0x55,8);
      auVar4 = vpinsrb_avx(auVar4,0x55,9);
      auVar4 = vpinsrb_avx(auVar4,0x55,10);
      auVar4 = vpinsrb_avx(auVar4,0x55,0xb);
      auVar4 = vpinsrb_avx(auVar4,0x55,0xc);
      auVar4 = vpinsrb_avx(auVar4,0x55,0xd);
      auVar4 = vpinsrb_avx(auVar4,0x55,0xe);
      local_1d8 = vpinsrb_avx(auVar4,0x55,0xf);
      local_998 = local_1d8._0_8_;
      uStack_990 = local_1d8._8_8_;
      auVar4 = vpand_avx(local_988,local_1d8);
      local_10b8 = auVar2._0_8_;
      uStack_10b0 = auVar2._8_8_;
      local_cda = 0x101;
      local_cba = 0x101;
      local_cbc = 0x101;
      local_cbe = 0x101;
      local_cc0 = 0x101;
      local_cc2 = 0x101;
      local_cc4 = 0x101;
      local_cc6 = 0x101;
      local_cc8 = 0x101;
      auVar3 = vpinsrw_avx(ZEXT216(0x101),0x101,1);
      auVar3 = vpinsrw_avx(auVar3,0x101,2);
      auVar3 = vpinsrw_avx(auVar3,0x101,3);
      auVar3 = vpinsrw_avx(auVar3,0x101,4);
      auVar3 = vpinsrw_avx(auVar3,0x101,5);
      auVar3 = vpinsrw_avx(auVar3,0x101,6);
      local_cd8 = vpinsrw_avx(auVar3,0x101,7);
      local_2a8 = local_10b8;
      uStack_2a0 = uStack_10b0;
      local_2b8 = local_cd8._0_8_;
      uStack_2b0 = local_cd8._8_8_;
      auVar3 = vpmaddubsw_avx(auVar2,local_cd8);
      local_10c8 = auVar4._0_8_;
      uStack_10c0 = auVar4._8_8_;
      local_cdc = 0x101;
      local_c9a = 0x101;
      local_c9c = 0x101;
      local_c9e = 0x101;
      local_ca0 = 0x101;
      local_ca2 = 0x101;
      local_ca4 = 0x101;
      local_ca6 = 0x101;
      local_ca8 = 0x101;
      auVar2 = vpinsrw_avx(ZEXT216(0x101),0x101,1);
      auVar2 = vpinsrw_avx(auVar2,0x101,2);
      auVar2 = vpinsrw_avx(auVar2,0x101,3);
      auVar2 = vpinsrw_avx(auVar2,0x101,4);
      auVar2 = vpinsrw_avx(auVar2,0x101,5);
      auVar2 = vpinsrw_avx(auVar2,0x101,6);
      local_cb8 = vpinsrw_avx(auVar2,0x101,7);
      local_2c8 = local_10c8;
      uStack_2c0 = uStack_10c0;
      local_2d8 = local_cb8._0_8_;
      uStack_2d0 = local_cb8._8_8_;
      auVar2 = vpmaddubsw_avx(auVar4,local_cb8);
      local_10d8 = auVar3._0_8_;
      uStack_10d0 = auVar3._8_8_;
      local_10e8 = auVar2._0_8_;
      uStack_10e0 = auVar2._8_8_;
      local_378 = local_10e8;
      uStack_370 = uStack_10e0;
      local_37c = 8;
      local_848 = vpslld_avx(auVar2,ZEXT416(8));
      local_838 = local_10d8;
      uStack_830 = uStack_10d0;
      auVar4 = vpor_avx(auVar3,local_848);
      local_10f8 = auVar4._0_8_;
      uStack_10f0 = auVar4._8_8_;
      local_86b = 0x33;
      local_199 = 0x33;
      local_19a = 0x33;
      local_19b = 0x33;
      local_19c = 0x33;
      local_19d = 0x33;
      local_19e = 0x33;
      local_19f = 0x33;
      local_1a0 = 0x33;
      local_1a1 = 0x33;
      local_1a2 = 0x33;
      local_1a3 = 0x33;
      local_1a4 = 0x33;
      local_1a5 = 0x33;
      local_1a6 = 0x33;
      local_1a7 = 0x33;
      local_1a8 = 0x33;
      auVar2 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
      auVar2 = vpinsrb_avx(auVar2,0x33,2);
      auVar2 = vpinsrb_avx(auVar2,0x33,3);
      auVar2 = vpinsrb_avx(auVar2,0x33,4);
      auVar2 = vpinsrb_avx(auVar2,0x33,5);
      auVar2 = vpinsrb_avx(auVar2,0x33,6);
      auVar2 = vpinsrb_avx(auVar2,0x33,7);
      auVar2 = vpinsrb_avx(auVar2,0x33,8);
      auVar2 = vpinsrb_avx(auVar2,0x33,9);
      auVar2 = vpinsrb_avx(auVar2,0x33,10);
      auVar2 = vpinsrb_avx(auVar2,0x33,0xb);
      auVar2 = vpinsrb_avx(auVar2,0x33,0xc);
      auVar2 = vpinsrb_avx(auVar2,0x33,0xd);
      auVar2 = vpinsrb_avx(auVar2,0x33,0xe);
      local_1b8 = vpinsrb_avx(auVar2,0x33,0xf);
      local_9a8 = local_10f8;
      uStack_9a0 = uStack_10f0;
      local_9b8 = local_1b8._0_8_;
      uStack_9b0 = local_1b8._8_8_;
      auVar2 = vpand_avx(auVar4,local_1b8);
      local_4e8 = local_10f8;
      uStack_4e0 = uStack_10f0;
      local_4ec = 2;
      local_9c8 = vpsrld_avx(auVar4,ZEXT416(2));
      local_86c = 0x33;
      local_179 = 0x33;
      local_17a = 0x33;
      local_17b = 0x33;
      local_17c = 0x33;
      local_17d = 0x33;
      local_17e = 0x33;
      local_17f = 0x33;
      local_180 = 0x33;
      local_181 = 0x33;
      local_182 = 0x33;
      local_183 = 0x33;
      local_184 = 0x33;
      local_185 = 0x33;
      local_186 = 0x33;
      local_187 = 0x33;
      local_188 = 0x33;
      auVar4 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
      auVar4 = vpinsrb_avx(auVar4,0x33,2);
      auVar4 = vpinsrb_avx(auVar4,0x33,3);
      auVar4 = vpinsrb_avx(auVar4,0x33,4);
      auVar4 = vpinsrb_avx(auVar4,0x33,5);
      auVar4 = vpinsrb_avx(auVar4,0x33,6);
      auVar4 = vpinsrb_avx(auVar4,0x33,7);
      auVar4 = vpinsrb_avx(auVar4,0x33,8);
      auVar4 = vpinsrb_avx(auVar4,0x33,9);
      auVar4 = vpinsrb_avx(auVar4,0x33,10);
      auVar4 = vpinsrb_avx(auVar4,0x33,0xb);
      auVar4 = vpinsrb_avx(auVar4,0x33,0xc);
      auVar4 = vpinsrb_avx(auVar4,0x33,0xd);
      auVar4 = vpinsrb_avx(auVar4,0x33,0xe);
      local_198 = vpinsrb_avx(auVar4,0x33,0xf);
      local_9d8 = local_198._0_8_;
      uStack_9d0 = local_198._8_8_;
      auVar4 = vpand_avx(local_9c8,local_198);
      local_1108 = auVar2._0_8_;
      uStack_1100 = auVar2._8_8_;
      local_4a0 = 0x10001;
      local_dc = 0x10001;
      local_e0 = 0x10001;
      local_e4 = 0x10001;
      local_e8 = 0x10001;
      auVar3 = vpinsrd_avx(ZEXT416(0x10001),0x10001,1);
      auVar3 = vpinsrd_avx(auVar3,0x10001,2);
      local_f8 = vpinsrd_avx(auVar3,0x10001,3);
      local_228 = local_1108;
      uStack_220 = uStack_1100;
      local_238 = local_f8._0_8_;
      uStack_230 = local_f8._8_8_;
      auVar3 = vpmaddwd_avx(auVar2,local_f8);
      local_1118 = auVar4._0_8_;
      uStack_1110 = auVar4._8_8_;
      local_4a4 = 0x10001;
      local_bc = 0x10001;
      local_c0 = 0x10001;
      local_c4 = 0x10001;
      local_c8 = 0x10001;
      auVar2 = vpinsrd_avx(ZEXT416(0x10001),0x10001,1);
      auVar2 = vpinsrd_avx(auVar2,0x10001,2);
      local_d8 = vpinsrd_avx(auVar2,0x10001,3);
      local_248 = local_1118;
      uStack_240 = uStack_1110;
      local_258 = local_d8._0_8_;
      uStack_250 = local_d8._8_8_;
      auVar4 = vpmaddwd_avx(auVar4,local_d8);
      local_4a8 = 0xf;
      local_9c = 0xf;
      local_a0 = 0xf;
      local_a4 = 0xf;
      local_a8 = 0xf;
      auVar2 = vpinsrd_avx(ZEXT416(0xf),0xf,1);
      auVar2 = vpinsrd_avx(auVar2,0xf,2);
      local_b8 = vpinsrd_avx(auVar2,0xf,3);
      local_1128 = auVar3._0_8_;
      uStack_1120 = auVar3._8_8_;
      local_9e8 = local_1128;
      uStack_9e0 = uStack_1120;
      local_9f8 = local_b8._0_8_;
      uStack_9f0 = local_b8._8_8_;
      local_d08 = vpand_avx(auVar3,local_b8);
      local_cf8 = local_1078._0_8_;
      uStack_cf0 = local_1078._8_8_;
      local_1078 = vpaddd_avx(local_1078,local_d08);
      local_508 = local_1128;
      uStack_500 = uStack_1120;
      local_50c = 4;
      local_a08 = vpsrld_avx(auVar3,ZEXT416(4));
      local_a18 = local_b8._0_8_;
      uStack_a10 = local_b8._8_8_;
      local_d28 = vpand_avx(local_a08,local_b8);
      local_d18 = local_1068._0_8_;
      uStack_d10 = local_1068._8_8_;
      local_1068 = vpaddd_avx(local_1068,local_d28);
      local_528 = local_1128;
      uStack_520 = uStack_1120;
      local_52c = 8;
      local_a28 = vpsrld_avx(auVar3,ZEXT416(8));
      local_a38 = local_b8._0_8_;
      uStack_a30 = local_b8._8_8_;
      local_d48 = vpand_avx(local_a28,local_b8);
      local_d38 = local_1058._0_8_;
      uStack_d30 = local_1058._8_8_;
      local_1058 = vpaddd_avx(local_1058,local_d48);
      local_548 = local_1128;
      uStack_540 = uStack_1120;
      local_54c = 0xc;
      local_a48 = vpsrld_avx(auVar3,ZEXT416(0xc));
      local_a58 = local_b8._0_8_;
      uStack_a50 = local_b8._8_8_;
      local_d68 = vpand_avx(local_a48,local_b8);
      local_d58 = local_1048._0_8_;
      uStack_d50 = local_1048._8_8_;
      local_1048 = vpaddd_avx(local_1048,local_d68);
      local_1138 = auVar4._0_8_;
      uStack_1130 = auVar4._8_8_;
      local_a68 = local_1138;
      uStack_a60 = uStack_1130;
      local_a78 = local_b8._0_8_;
      uStack_a70 = local_b8._8_8_;
      local_d88 = vpand_avx(auVar4,local_b8);
      local_d78 = local_1038._0_8_;
      uStack_d70 = local_1038._8_8_;
      local_1038 = vpaddd_avx(local_1038,local_d88);
      local_568 = local_1138;
      uStack_560 = uStack_1130;
      local_56c = 4;
      local_a88 = vpsrld_avx(auVar4,ZEXT416(4));
      local_a98 = local_b8._0_8_;
      uStack_a90 = local_b8._8_8_;
      local_da8 = vpand_avx(local_a88,local_b8);
      local_d98 = local_1028._0_8_;
      uStack_d90 = local_1028._8_8_;
      local_1028 = vpaddd_avx(local_1028,local_da8);
      local_588 = local_1138;
      uStack_580 = uStack_1130;
      local_58c = 8;
      local_aa8 = vpsrld_avx(auVar4,ZEXT416(8));
      local_ab8 = local_b8._0_8_;
      uStack_ab0 = local_b8._8_8_;
      local_dc8 = vpand_avx(local_aa8,local_b8);
      local_db8 = local_1018._0_8_;
      uStack_db0 = local_1018._8_8_;
      local_1018 = vpaddd_avx(local_1018,local_dc8);
      local_5a8 = local_1138;
      uStack_5a0 = uStack_1130;
      local_5ac = 0xc;
      local_ac8 = vpsrld_avx(auVar4,ZEXT416(0xc));
      local_ad8 = local_b8._0_8_;
      uStack_ad0 = local_b8._8_8_;
      local_de8 = vpand_avx(local_ac8,local_b8);
      local_dd8 = local_1008._0_8_;
      uStack_dd0 = local_1008._8_8_;
      local_1008 = vpaddd_avx(local_1008,local_de8);
      b_13[1]._0_4_ = 0xf;
      b_13[0] = 0xf;
      b_13[1]._4_4_ = 0;
      c_13[1] = lVar11;
      c_13[0] = lVar10;
      pospopcnt_csa_sse((__m128i *)&local_f78,(__m128i *)local_f68,b_13,c_13);
      lVar9 = extraout_RDX_12;
    }
    local_348 = local_f78;
    lStack_340 = lStack_f70;
    local_358 = uVar5;
    uStack_350 = uVar6;
    auVar4._8_8_ = lStack_f70;
    auVar4._0_8_ = local_f78;
    auVar4 = vpshufb_avx(auVar4,auVar1);
    local_1158 = auVar4._0_8_;
    uStack_1150 = auVar4._8_8_;
    local_86d = 0x55;
    local_159 = 0x55;
    local_15a = 0x55;
    local_15b = 0x55;
    local_15c = 0x55;
    local_15d = 0x55;
    local_15e = 0x55;
    local_15f = 0x55;
    local_160 = 0x55;
    local_161 = 0x55;
    local_162 = 0x55;
    local_163 = 0x55;
    local_164 = 0x55;
    local_165 = 0x55;
    local_166 = 0x55;
    local_167 = 0x55;
    local_168 = 0x55;
    auVar2 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
    auVar2 = vpinsrb_avx(auVar2,0x55,2);
    auVar2 = vpinsrb_avx(auVar2,0x55,3);
    auVar2 = vpinsrb_avx(auVar2,0x55,4);
    auVar2 = vpinsrb_avx(auVar2,0x55,5);
    auVar2 = vpinsrb_avx(auVar2,0x55,6);
    auVar2 = vpinsrb_avx(auVar2,0x55,7);
    auVar2 = vpinsrb_avx(auVar2,0x55,8);
    auVar2 = vpinsrb_avx(auVar2,0x55,9);
    auVar2 = vpinsrb_avx(auVar2,0x55,10);
    auVar2 = vpinsrb_avx(auVar2,0x55,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x55,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x55,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x55,0xe);
    local_178 = vpinsrb_avx(auVar2,0x55,0xf);
    local_ae8 = local_1158;
    uStack_ae0 = uStack_1150;
    local_af8 = local_178._0_8_;
    uStack_af0 = local_178._8_8_;
    auVar2 = vpand_avx(auVar4,local_178);
    local_5c8 = local_1158;
    uStack_5c0 = uStack_1150;
    local_5cc = 1;
    local_b08 = vpsrld_avx(auVar4,ZEXT416(1));
    local_86e = 0x55;
    local_139 = 0x55;
    local_13a = 0x55;
    local_13b = 0x55;
    local_13c = 0x55;
    local_13d = 0x55;
    local_13e = 0x55;
    local_13f = 0x55;
    local_140 = 0x55;
    local_141 = 0x55;
    local_142 = 0x55;
    local_143 = 0x55;
    local_144 = 0x55;
    local_145 = 0x55;
    local_146 = 0x55;
    local_147 = 0x55;
    local_148 = 0x55;
    auVar4 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
    auVar4 = vpinsrb_avx(auVar4,0x55,2);
    auVar4 = vpinsrb_avx(auVar4,0x55,3);
    auVar4 = vpinsrb_avx(auVar4,0x55,4);
    auVar4 = vpinsrb_avx(auVar4,0x55,5);
    auVar4 = vpinsrb_avx(auVar4,0x55,6);
    auVar4 = vpinsrb_avx(auVar4,0x55,7);
    auVar4 = vpinsrb_avx(auVar4,0x55,8);
    auVar4 = vpinsrb_avx(auVar4,0x55,9);
    auVar4 = vpinsrb_avx(auVar4,0x55,10);
    auVar4 = vpinsrb_avx(auVar4,0x55,0xb);
    auVar4 = vpinsrb_avx(auVar4,0x55,0xc);
    auVar4 = vpinsrb_avx(auVar4,0x55,0xd);
    auVar4 = vpinsrb_avx(auVar4,0x55,0xe);
    local_158 = vpinsrb_avx(auVar4,0x55,0xf);
    local_b18 = local_158._0_8_;
    uStack_b10 = local_158._8_8_;
    auVar4 = vpand_avx(local_b08,local_158);
    local_1168 = auVar2._0_8_;
    uStack_1160 = auVar2._8_8_;
    local_cde = 0x101;
    local_c7a = 0x101;
    local_c7c = 0x101;
    local_c7e = 0x101;
    local_c80 = 0x101;
    local_c82 = 0x101;
    local_c84 = 0x101;
    local_c86 = 0x101;
    local_c88 = 0x101;
    auVar3 = vpinsrw_avx(ZEXT216(0x101),0x101,1);
    auVar3 = vpinsrw_avx(auVar3,0x101,2);
    auVar3 = vpinsrw_avx(auVar3,0x101,3);
    auVar3 = vpinsrw_avx(auVar3,0x101,4);
    auVar3 = vpinsrw_avx(auVar3,0x101,5);
    auVar3 = vpinsrw_avx(auVar3,0x101,6);
    local_c98 = vpinsrw_avx(auVar3,0x101,7);
    local_2e8 = local_1168;
    uStack_2e0 = uStack_1160;
    local_2f8 = local_c98._0_8_;
    uStack_2f0 = local_c98._8_8_;
    auVar3 = vpmaddubsw_avx(auVar2,local_c98);
    local_1178 = auVar4._0_8_;
    uStack_1170 = auVar4._8_8_;
    local_ce0 = 0x101;
    local_c5a = 0x101;
    local_c5c = 0x101;
    local_c5e = 0x101;
    local_c60 = 0x101;
    local_c62 = 0x101;
    local_c64 = 0x101;
    local_c66 = 0x101;
    local_c68 = 0x101;
    auVar2 = vpinsrw_avx(ZEXT216(0x101),0x101,1);
    auVar2 = vpinsrw_avx(auVar2,0x101,2);
    auVar2 = vpinsrw_avx(auVar2,0x101,3);
    auVar2 = vpinsrw_avx(auVar2,0x101,4);
    auVar2 = vpinsrw_avx(auVar2,0x101,5);
    auVar2 = vpinsrw_avx(auVar2,0x101,6);
    local_c78 = vpinsrw_avx(auVar2,0x101,7);
    local_308 = local_1178;
    uStack_300 = uStack_1170;
    local_318 = local_c78._0_8_;
    uStack_310 = local_c78._8_8_;
    auVar2 = vpmaddubsw_avx(auVar4,local_c78);
    local_1188 = auVar3._0_8_;
    uStack_1180 = auVar3._8_8_;
    local_1198 = auVar2._0_8_;
    uStack_1190 = auVar2._8_8_;
    local_398 = local_1198;
    uStack_390 = uStack_1190;
    local_39c = 8;
    local_868 = vpslld_avx(auVar2,ZEXT416(8));
    local_858 = local_1188;
    uStack_850 = uStack_1180;
    auVar4 = vpor_avx(auVar3,local_868);
    local_11a8 = auVar4._0_8_;
    uStack_11a0 = auVar4._8_8_;
    local_86f = 0x33;
    local_119 = 0x33;
    local_11a = 0x33;
    local_11b = 0x33;
    local_11c = 0x33;
    local_11d = 0x33;
    local_11e = 0x33;
    local_11f = 0x33;
    local_120 = 0x33;
    local_121 = 0x33;
    local_122 = 0x33;
    local_123 = 0x33;
    local_124 = 0x33;
    local_125 = 0x33;
    local_126 = 0x33;
    local_127 = 0x33;
    local_128 = 0x33;
    auVar2 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
    auVar2 = vpinsrb_avx(auVar2,0x33,2);
    auVar2 = vpinsrb_avx(auVar2,0x33,3);
    auVar2 = vpinsrb_avx(auVar2,0x33,4);
    auVar2 = vpinsrb_avx(auVar2,0x33,5);
    auVar2 = vpinsrb_avx(auVar2,0x33,6);
    auVar2 = vpinsrb_avx(auVar2,0x33,7);
    auVar2 = vpinsrb_avx(auVar2,0x33,8);
    auVar2 = vpinsrb_avx(auVar2,0x33,9);
    auVar2 = vpinsrb_avx(auVar2,0x33,10);
    auVar2 = vpinsrb_avx(auVar2,0x33,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x33,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x33,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x33,0xe);
    local_138 = vpinsrb_avx(auVar2,0x33,0xf);
    local_b28 = local_11a8;
    uStack_b20 = uStack_11a0;
    local_b38 = local_138._0_8_;
    uStack_b30 = local_138._8_8_;
    auVar2 = vpand_avx(auVar4,local_138);
    local_5e8 = local_11a8;
    uStack_5e0 = uStack_11a0;
    local_5ec = 2;
    local_b48 = vpsrld_avx(auVar4,ZEXT416(2));
    local_870 = 0x33;
    local_f9 = 0x33;
    local_fa = 0x33;
    local_fb = 0x33;
    local_fc = 0x33;
    local_fd = 0x33;
    local_fe = 0x33;
    local_ff = 0x33;
    local_100 = 0x33;
    local_101 = 0x33;
    local_102 = 0x33;
    local_103 = 0x33;
    local_104 = 0x33;
    local_105 = 0x33;
    local_106 = 0x33;
    local_107 = 0x33;
    local_108 = 0x33;
    auVar4 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
    auVar4 = vpinsrb_avx(auVar4,0x33,2);
    auVar4 = vpinsrb_avx(auVar4,0x33,3);
    auVar4 = vpinsrb_avx(auVar4,0x33,4);
    auVar4 = vpinsrb_avx(auVar4,0x33,5);
    auVar4 = vpinsrb_avx(auVar4,0x33,6);
    auVar4 = vpinsrb_avx(auVar4,0x33,7);
    auVar4 = vpinsrb_avx(auVar4,0x33,8);
    auVar4 = vpinsrb_avx(auVar4,0x33,9);
    auVar4 = vpinsrb_avx(auVar4,0x33,10);
    auVar4 = vpinsrb_avx(auVar4,0x33,0xb);
    auVar4 = vpinsrb_avx(auVar4,0x33,0xc);
    auVar4 = vpinsrb_avx(auVar4,0x33,0xd);
    auVar4 = vpinsrb_avx(auVar4,0x33,0xe);
    local_118 = vpinsrb_avx(auVar4,0x33,0xf);
    local_b58 = local_118._0_8_;
    uStack_b50 = local_118._8_8_;
    auVar4 = vpand_avx(local_b48,local_118);
    local_11b8 = auVar2._0_8_;
    uStack_11b0 = auVar2._8_8_;
    local_4ac = 0x10001;
    local_7c = 0x10001;
    local_80 = 0x10001;
    local_84 = 0x10001;
    local_88 = 0x10001;
    auVar3 = vpinsrd_avx(ZEXT416(0x10001),0x10001,1);
    auVar3 = vpinsrd_avx(auVar3,0x10001,2);
    local_98 = vpinsrd_avx(auVar3,0x10001,3);
    local_268 = local_11b8;
    uStack_260 = uStack_11b0;
    local_278 = local_98._0_8_;
    uStack_270 = local_98._8_8_;
    auVar3 = vpmaddwd_avx(auVar2,local_98);
    local_11c8 = auVar4._0_8_;
    uStack_11c0 = auVar4._8_8_;
    local_4b0 = 0x10001;
    local_5c = 0x10001;
    local_60 = 0x10001;
    local_64 = 0x10001;
    local_68 = 0x10001;
    auVar2 = vpinsrd_avx(ZEXT416(0x10001),0x10001,1);
    auVar2 = vpinsrd_avx(auVar2,0x10001,2);
    local_78 = vpinsrd_avx(auVar2,0x10001,3);
    local_288 = local_11c8;
    uStack_280 = uStack_11c0;
    local_298 = local_78._0_8_;
    uStack_290 = local_78._8_8_;
    auVar4 = vpmaddwd_avx(auVar4,local_78);
    local_4b4 = 0xf;
    local_34 = 0xf;
    local_38 = 0xf;
    local_3c = 0xf;
    local_40 = 0xf;
    lVar9 = 0xf;
    auVar2 = vpinsrd_avx(ZEXT416(0xf),0xf,1);
    auVar2 = vpinsrd_avx(auVar2,0xf,2);
    local_58 = vpinsrd_avx(auVar2,0xf,3);
    local_11d8 = auVar3._0_8_;
    uStack_11d0 = auVar3._8_8_;
    local_b68 = local_11d8;
    uStack_b60 = uStack_11d0;
    local_b78 = local_58._0_8_;
    uStack_b70 = local_58._8_8_;
    local_e08 = vpand_avx(auVar3,local_58);
    local_df8 = local_1078._0_8_;
    uStack_df0 = local_1078._8_8_;
    local_1078 = vpaddd_avx(local_1078,local_e08);
    local_608 = local_11d8;
    uStack_600 = uStack_11d0;
    local_60c = 4;
    local_b88 = vpsrld_avx(auVar3,ZEXT416(4));
    local_b98 = local_58._0_8_;
    uStack_b90 = local_58._8_8_;
    local_e28 = vpand_avx(local_b88,local_58);
    local_e18 = local_1068._0_8_;
    uStack_e10 = local_1068._8_8_;
    local_1068 = vpaddd_avx(local_1068,local_e28);
    local_628 = local_11d8;
    uStack_620 = uStack_11d0;
    local_62c = 8;
    local_ba8 = vpsrld_avx(auVar3,ZEXT416(8));
    local_bb8 = local_58._0_8_;
    uStack_bb0 = local_58._8_8_;
    local_e48 = vpand_avx(local_ba8,local_58);
    local_e38 = local_1058._0_8_;
    uStack_e30 = local_1058._8_8_;
    local_1058 = vpaddd_avx(local_1058,local_e48);
    local_648 = local_11d8;
    uStack_640 = uStack_11d0;
    local_64c = 0xc;
    local_bc8 = vpsrld_avx(auVar3,ZEXT416(0xc));
    local_bd8 = local_58._0_8_;
    uStack_bd0 = local_58._8_8_;
    local_e68 = vpand_avx(local_bc8,local_58);
    local_e58 = local_1048._0_8_;
    uStack_e50 = local_1048._8_8_;
    local_1048 = vpaddd_avx(local_1048,local_e68);
    local_11e8 = auVar4._0_8_;
    uStack_11e0 = auVar4._8_8_;
    local_be8 = local_11e8;
    uStack_be0 = uStack_11e0;
    local_bf8 = local_58._0_8_;
    uStack_bf0 = local_58._8_8_;
    local_e88 = vpand_avx(auVar4,local_58);
    local_e78 = local_1038._0_8_;
    uStack_e70 = local_1038._8_8_;
    local_1038 = vpaddd_avx(local_1038,local_e88);
    local_668 = local_11e8;
    uStack_660 = uStack_11e0;
    local_66c = 4;
    local_c08 = vpsrld_avx(auVar4,ZEXT416(4));
    local_c18 = local_58._0_8_;
    uStack_c10 = local_58._8_8_;
    local_ea8 = vpand_avx(local_c08,local_58);
    local_e98 = local_1028._0_8_;
    uStack_e90 = local_1028._8_8_;
    local_1028 = vpaddd_avx(local_1028,local_ea8);
    local_688 = local_11e8;
    uStack_680 = uStack_11e0;
    local_68c = 8;
    local_c28 = vpsrld_avx(auVar4,ZEXT416(8));
    local_c38 = local_58._0_8_;
    uStack_c30 = local_58._8_8_;
    local_ec8 = vpand_avx(local_c28,local_58);
    local_eb8 = local_1018._0_8_;
    uStack_eb0 = local_1018._8_8_;
    local_1018 = vpaddd_avx(local_1018,local_ec8);
    local_6a8 = local_11e8;
    uStack_6a0 = uStack_11e0;
    local_6ac = 0xc;
    local_c48 = vpsrld_avx(auVar4,ZEXT416(0xc));
    local_c58 = local_58._0_8_;
    uStack_c50 = local_58._8_8_;
    local_ee8 = vpand_avx(local_c48,local_58);
    local_ed8 = local_1008._0_8_;
    uStack_ed0 = local_1008._8_8_;
    local_1008 = vpaddd_avx(local_1008,local_ee8);
    local_6b8 = local_ff8;
    local_3b8 = local_1078._0_8_;
    uStack_3b0 = local_1078._8_8_;
    local_3bc = 4;
    local_6c8 = vpslld_avx(local_1078,ZEXT416(4));
    local_ff8[1] = local_6c8._4_4_;
    local_ff8[0] = local_6c8._0_4_;
    local_ff8[3] = local_6c8._12_4_;
    local_ff8[2] = local_6c8._8_4_;
    *local_f00 = local_ff8[0] + *local_f00;
    local_f00[8] = local_ff8[1] + local_f00[8];
    local_f00[0x10] = local_ff8[2] + local_f00[0x10];
    local_f00[0x18] = local_ff8[3] + local_f00[0x18];
    local_6d0 = local_ff8;
    local_3d8 = local_1068._0_8_;
    uStack_3d0 = local_1068._8_8_;
    local_3dc = 4;
    local_6e8 = vpslld_avx(local_1068,ZEXT416(4));
    local_ff8[1] = local_6e8._4_4_;
    local_ff8[0] = local_6e8._0_4_;
    local_ff8[3] = local_6e8._12_4_;
    local_ff8[2] = local_6e8._8_4_;
    local_f00[4] = local_ff8[0] + local_f00[4];
    local_f00[0xc] = local_ff8[1] + local_f00[0xc];
    local_f00[0x14] = local_ff8[2] + local_f00[0x14];
    local_f00[0x1c] = local_ff8[3] + local_f00[0x1c];
    local_6f0 = local_ff8;
    local_3f8 = local_1058._0_8_;
    uStack_3f0 = local_1058._8_8_;
    local_3fc = 4;
    local_708 = vpslld_avx(local_1058,ZEXT416(4));
    local_ff8[1] = local_708._4_4_;
    local_ff8[0] = local_708._0_4_;
    local_ff8[3] = local_708._12_4_;
    local_ff8[2] = local_708._8_4_;
    local_f00[1] = local_ff8[0] + local_f00[1];
    local_f00[9] = local_ff8[1] + local_f00[9];
    local_f00[0x11] = local_ff8[2] + local_f00[0x11];
    local_f00[0x19] = local_ff8[3] + local_f00[0x19];
    local_710 = local_ff8;
    local_418 = local_1048._0_8_;
    uStack_410 = local_1048._8_8_;
    local_41c = 4;
    local_728 = vpslld_avx(local_1048,ZEXT416(4));
    local_ff8[1] = local_728._4_4_;
    local_ff8[0] = local_728._0_4_;
    local_ff8[3] = local_728._12_4_;
    local_ff8[2] = local_728._8_4_;
    local_f00[5] = local_ff8[0] + local_f00[5];
    local_f00[0xd] = local_ff8[1] + local_f00[0xd];
    local_f00[0x15] = local_ff8[2] + local_f00[0x15];
    local_f00[0x1d] = local_ff8[3] + local_f00[0x1d];
    local_730 = local_ff8;
    local_438 = local_1038._0_8_;
    uStack_430 = local_1038._8_8_;
    local_43c = 4;
    local_748 = vpslld_avx(local_1038,ZEXT416(4));
    local_ff8[1] = local_748._4_4_;
    local_ff8[0] = local_748._0_4_;
    local_ff8[3] = local_748._12_4_;
    local_ff8[2] = local_748._8_4_;
    local_f00[2] = local_ff8[0] + local_f00[2];
    local_f00[10] = local_ff8[1] + local_f00[10];
    local_f00[0x12] = local_ff8[2] + local_f00[0x12];
    local_f00[0x1a] = local_ff8[3] + local_f00[0x1a];
    local_750 = local_ff8;
    local_458 = local_1028._0_8_;
    uStack_450 = local_1028._8_8_;
    local_45c = 4;
    local_768 = vpslld_avx(local_1028,ZEXT416(4));
    local_ff8[1] = local_768._4_4_;
    local_ff8[0] = local_768._0_4_;
    local_ff8[3] = local_768._12_4_;
    local_ff8[2] = local_768._8_4_;
    local_f00[6] = local_ff8[0] + local_f00[6];
    local_f00[0xe] = local_ff8[1] + local_f00[0xe];
    local_f00[0x16] = local_ff8[2] + local_f00[0x16];
    local_f00[0x1e] = local_ff8[3] + local_f00[0x1e];
    local_770 = local_ff8;
    local_478 = local_1018._0_8_;
    uStack_470 = local_1018._8_8_;
    local_47c = 4;
    local_788 = vpslld_avx(local_1018,ZEXT416(4));
    local_ff8[1] = local_788._4_4_;
    local_ff8[0] = local_788._0_4_;
    local_ff8[3] = local_788._12_4_;
    local_ff8[2] = local_788._8_4_;
    local_f00[3] = local_ff8[0] + local_f00[3];
    local_f00[0xb] = local_ff8[1] + local_f00[0xb];
    local_f00[0x13] = local_ff8[2] + local_f00[0x13];
    local_f00[0x1b] = local_ff8[3] + local_f00[0x1b];
    local_790 = local_ff8;
    local_498 = local_1008._0_8_;
    uStack_490 = local_1008._8_8_;
    local_49c = 4;
    local_7a8 = vpslld_avx(local_1008,ZEXT416(4));
    local_ff8[1] = local_7a8._4_4_;
    local_ff8[0] = local_7a8._0_4_;
    local_ff8[3] = local_7a8._12_4_;
    local_ff8[2] = local_7a8._8_4_;
    local_f00[7] = local_ff8[0] + local_f00[7];
    local_f00[0xf] = local_ff8[1] + local_f00[0xf];
    local_f00[0x17] = local_ff8[2] + local_f00[0x17];
    local_f00[0x1f] = local_ff8[3] + local_f00[0x1f];
  }
  for (local_1200 = 0; local_1200 < 4; local_1200 = local_1200 + 1) {
    for (local_1204 = 0; local_1204 < 0x20; local_1204 = local_1204 + 1) {
      local_f00[local_1204] =
           ((local_ff8[local_1200] & 1 << ((byte)local_1204 & 0x1f)) >> ((byte)local_1204 & 0x1f)) +
           local_f00[local_1204];
    }
  }
  for (local_1210 = 0; local_1210 < 4; local_1210 = local_1210 + 1) {
    for (local_1214 = 0; local_1214 < 0x20; local_1214 = local_1214 + 1) {
      local_f00[local_1214] =
           ((local_ff8[local_1210] & 1 << ((byte)local_1214 & 0x1f)) >> ((byte)local_1214 & 0x1f)) *
           2 + local_f00[local_1214];
    }
  }
  for (local_1220 = 0; local_1220 < 4; local_1220 = local_1220 + 1) {
    for (local_1224 = 0; local_1224 < 0x20; local_1224 = local_1224 + 1) {
      local_f00[local_1224] =
           ((local_ff8[local_1220] & 1 << ((byte)local_1224 & 0x1f)) >> ((byte)local_1224 & 0x1f)) *
           4 + local_f00[local_1224];
    }
  }
  for (local_1230 = 0; local_1230 < 4; local_1230 = local_1230 + 1) {
    for (local_1234 = 0; local_1234 < 0x20; local_1234 = local_1234 + 1) {
      local_f00[local_1234] =
           ((local_ff8[local_1230] & 1 << ((byte)local_1234 & 0x1f)) >> ((byte)local_1234 & 0x1f)) *
           8 + local_f00[local_1234];
    }
  }
  return;
}

Assistant:

void pospopcnt_u32_sse_harley_seal_improved(const uint32_t* array, size_t len, uint32_t* flags) {
    for (size_t i = len - (len % (16 * 4)); i < len; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 4;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint32_t buffer[4];
    __m128i counter[8];

    const __m128i lookup = _mm_setr_epi8( 0,  4,  8, 12,
                                          1,  5,  9, 13,
                                          2,  6, 10, 14,
                                          3,  7, 11, 15);

    while (i < limit) {
        for (size_t i = 0; i < 8; ++i) {
            counter[i] = _mm_setzero_si128();
        }

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);

            {
                const __m128i t0 = _mm_shuffle_epi8(v16, lookup);
                const __m128i m0 = _mm_and_si128(t0, _mm_set1_epi8(0x55));
                const __m128i m1 = _mm_and_si128(_mm_srli_epi32(t0, 1), _mm_set1_epi8(0x55));

                const __m128i s0 = _mm_maddubs_epi16(m0, _mm_set1_epi16(0x0101));
                const __m128i s1 = _mm_maddubs_epi16(m1, _mm_set1_epi16(0x0101));

                const __m128i t1 = _mm_or_si128(s0, _mm_slli_epi32(s1, 8));

                const __m128i n0 = _mm_and_si128(t1, _mm_set1_epi8(0x33));
                const __m128i n1 = _mm_and_si128(_mm_srli_epi32(t1, 2), _mm_set1_epi8(0x33));

                const __m128i S0 = _mm_madd_epi16(n0, _mm_set1_epi32(0x00010001));
                const __m128i S1 = _mm_madd_epi16(n1, _mm_set1_epi32(0x00010001));

                const __m128i mask = _mm_set1_epi32(0x0000000f);
                counter[0] = _mm_add_epi32(counter[0], _mm_and_si128(S0, mask));
                counter[1] = _mm_add_epi32(counter[1], _mm_and_si128(_mm_srli_epi32(S0,  4), mask));
                counter[2] = _mm_add_epi32(counter[2], _mm_and_si128(_mm_srli_epi32(S0,  8), mask));
                counter[3] = _mm_add_epi32(counter[3], _mm_and_si128(_mm_srli_epi32(S0, 12), mask));
                counter[4] = _mm_add_epi32(counter[4], _mm_and_si128(S1, mask));
                counter[5] = _mm_add_epi32(counter[5], _mm_and_si128(_mm_srli_epi32(S1,  4), mask));
                counter[6] = _mm_add_epi32(counter[6], _mm_and_si128(_mm_srli_epi32(S1,  8), mask));
                counter[7] = _mm_add_epi32(counter[7], _mm_and_si128(_mm_srli_epi32(S1, 12), mask));
            }

            pospopcnt_csa_sse(&v16,    &v8, eightsA, eightsB);
        }

        // update the counters after the last iteration
        {
            const __m128i t0 = _mm_shuffle_epi8(v16, lookup);

            const __m128i m0 = _mm_and_si128(t0, _mm_set1_epi8(0x55));
            const __m128i m1 = _mm_and_si128(_mm_srli_epi32(t0, 1), _mm_set1_epi8(0x55));

            const __m128i s0 = _mm_maddubs_epi16(m0, _mm_set1_epi16(0x0101));
            const __m128i s1 = _mm_maddubs_epi16(m1, _mm_set1_epi16(0x0101));

            const __m128i t1 = _mm_or_si128(s0, _mm_slli_epi32(s1, 8));

            const __m128i n0 = _mm_and_si128(t1, _mm_set1_epi8(0x33));
            const __m128i n1 = _mm_and_si128(_mm_srli_epi32(t1, 2), _mm_set1_epi8(0x33));

            const __m128i S0 = _mm_madd_epi16(n0, _mm_set1_epi32(0x00010001));
            const __m128i S1 = _mm_madd_epi16(n1, _mm_set1_epi32(0x00010001));

            const __m128i mask = _mm_set1_epi32(0x0000000f);
            counter[0] = _mm_add_epi32(counter[0], _mm_and_si128(S0, mask));
            counter[1] = _mm_add_epi32(counter[1], _mm_and_si128(_mm_srli_epi32(S0,  4), mask));
            counter[2] = _mm_add_epi32(counter[2], _mm_and_si128(_mm_srli_epi32(S0,  8), mask));
            counter[3] = _mm_add_epi32(counter[3], _mm_and_si128(_mm_srli_epi32(S0, 12), mask));
            counter[4] = _mm_add_epi32(counter[4], _mm_and_si128(S1, mask));
            counter[5] = _mm_add_epi32(counter[5], _mm_and_si128(_mm_srli_epi32(S1,  4), mask));
            counter[6] = _mm_add_epi32(counter[6], _mm_and_si128(_mm_srli_epi32(S1,  8), mask));
            counter[7] = _mm_add_epi32(counter[7], _mm_and_si128(_mm_srli_epi32(S1, 12), mask));

#define update_flags(counterN, index0, index1, index2, index3)      \
            _mm_storeu_si128((__m128i*)buffer, _mm_slli_epi32(counterN, 4));           \
            flags[index0] += buffer[0]; flags[index1] += buffer[1]; \
            flags[index2] += buffer[2]; flags[index3] += buffer[3];

            update_flags(counter[0], 0,  8, 16, 24);
            update_flags(counter[1], 4, 12, 20, 28);
            update_flags(counter[2], 1,  9, 17, 25);
            update_flags(counter[3], 5, 13, 21, 29);
            update_flags(counter[4], 2, 10, 18, 26);
            update_flags(counter[5], 6, 14, 22, 30);
            update_flags(counter[6], 3, 11, 19, 27);
            update_flags(counter[7], 7, 15, 23, 31);
#undef update_flags
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
}